

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__process_marker(stbi__jpeg *z,int m)

{
  ushort uVar1;
  stbi__context *s;
  byte bVar2;
  stbi_uc sVar3;
  byte bVar4;
  sbyte sVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  uint local_a8 [2];
  int sizes [16];
  
  if (m == 0xc4) {
    iVar7 = stbi__get16be(z->s);
    for (iVar7 = iVar7 + -2; 0 < iVar7; iVar7 = (iVar7 + -0x11) - (int)uVar13) {
      bVar2 = stbi__get8(z->s);
      if ((0x1f < bVar2) || (bVar11 = bVar2 & 0xf, 3 < bVar11)) {
        stbi__g_failure_reason = "bad DHT header";
        goto LAB_00122d7a;
      }
      uVar13 = 0;
      for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
        bVar4 = stbi__get8(z->s);
        local_a8[lVar12] = (uint)bVar4;
        uVar13 = (ulong)((int)uVar13 + (uint)bVar4);
      }
      if (bVar2 < 0x10) {
        iVar6 = stbi__build_huffman(z->huff_dc + bVar11,(int *)local_a8);
        lVar12 = 8;
      }
      else {
        iVar6 = stbi__build_huffman(z->huff_ac + bVar11,(int *)local_a8);
        lVar12 = 0x1a48;
      }
      if (iVar6 == 0) goto LAB_00122d7a;
      for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
        sVar3 = stbi__get8(z->s);
        z->huff_dc[bVar11].values[uVar10 + lVar12 + -8] = sVar3;
      }
      if (0xf < bVar2) {
        for (lVar12 = 0; lVar12 != 0x200; lVar12 = lVar12 + 1) {
          uVar10 = (ulong)z->huff_ac[bVar11].fast[lVar12];
          z->fast_ac[bVar11][lVar12] = 0;
          if (uVar10 != 0xff) {
            bVar2 = z->huff_ac[bVar11].values[uVar10];
            if ((bVar2 & 0xf) != 0) {
              bVar4 = z->huff_ac[bVar11].size[uVar10];
              uVar1 = (bVar2 & 0xf) + (ushort)bVar4;
              if (uVar1 < 10) {
                uVar9 = (int)lVar12 << (bVar4 & 0x1f) & 0x1ff;
                sVar5 = (sbyte)(bVar2 & 0xf);
                uVar8 = -1 << sVar5 | 1;
                if (0xff < uVar9) {
                  uVar8 = 0;
                }
                iVar6 = uVar8 + (uVar9 >> (9U - sVar5 & 0x1f));
                if ((char)iVar6 == iVar6) {
                  z->fast_ac[bVar11][lVar12] = (short)iVar6 * 0x100 | bVar2 & 0xfff0 | uVar1;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    if (m != 0xdb) {
      if (m == 0xdd) {
        iVar7 = stbi__get16be(z->s);
        if (iVar7 == 4) {
          iVar7 = stbi__get16be(z->s);
          z->restart_interval = iVar7;
LAB_00122d48:
          bVar14 = true;
          goto LAB_00122d7c;
        }
        stbi__g_failure_reason = "bad DRI len";
      }
      else if (m == 0xff) {
        stbi__g_failure_reason = "expected marker";
      }
      else if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
        s = z->s;
        iVar7 = stbi__get16be(s);
        stbi__skip(s,iVar7 + -2);
        goto LAB_00122d48;
      }
LAB_00122d7a:
      bVar14 = false;
      goto LAB_00122d7c;
    }
    iVar7 = stbi__get16be(z->s);
    for (iVar7 = iVar7 + -2; 0 < iVar7; iVar7 = iVar7 + -0x41) {
      bVar2 = stbi__get8(z->s);
      if (0xf < bVar2) {
        stbi__g_failure_reason = "bad DQT type";
        goto LAB_00122d7a;
      }
      if (3 < (bVar2 & 0xf)) {
        stbi__g_failure_reason = "bad DQT table";
        goto LAB_00122d7a;
      }
      for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 1) {
        sVar3 = stbi__get8(z->s);
        z->dequant[bVar2 & 0xf][""[lVar12]] = sVar3;
      }
    }
  }
  bVar14 = iVar7 == 0;
LAB_00122d7c:
  return (int)bVar14;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4;
            int t = q & 15,i;
            if (p != 0) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");
            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = stbi__get8(z->s);
            L -= 65;
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }
   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      stbi__skip(z->s, stbi__get16be(z->s)-2);
      return 1;
   }
   return 0;
}